

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevtablethandler.cpp
# Opt level: O2

void __thiscall
QEvdevTabletHandlerThread::~QEvdevTabletHandlerThread(QEvdevTabletHandlerThread *this)

{
  QDeadlineTimer QVar1;
  
  *(undefined ***)this = &PTR_metaObject_0010f670;
  QThread::quit();
  QVar1.t2 = 0xffffffff;
  QVar1.type = 0x7fffffff;
  QVar1.t1 = (qint64)this;
  QThread::wait(QVar1);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_spec).d);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_device).d);
  QDaemonThread::~QDaemonThread(&this->super_QDaemonThread);
  return;
}

Assistant:

QEvdevTabletHandlerThread::~QEvdevTabletHandlerThread()
{
    quit();
    wait();
}